

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

uint decodeUTF8(char **s)

{
  uint uVar1;
  uint count;
  uint ch;
  char **s_local;
  
  ch = 0;
  count = 0;
  uVar1 = count;
  do {
    count = uVar1;
    ch = ch * 0x40 + (uint)(byte)**s;
    *s = *s + 1;
    uVar1 = count + 1;
  } while (((int)**s & 0xc0U) == 0x80);
  return ch - decodeUTF8::offsets[count];
}

Assistant:

static unsigned int decodeUTF8(const char** s)
{
    unsigned int ch = 0, count = 0;
    static const unsigned int offsets[] =
    {
        0x00000000u, 0x00003080u, 0x000e2080u,
        0x03c82080u, 0xfa082080u, 0x82082080u
    };

    do
    {
        ch = (ch << 6) + (unsigned char) **s;
        (*s)++;
        count++;
    } while ((**s & 0xc0) == 0x80);

    assert(count <= 6);
    return ch - offsets[count - 1];
}